

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>_>
 __thiscall ninx::parser::Parser::parse_function_definition(Parser *this)

{
  string *this_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Token *pTVar4;
  ParserException *pPVar5;
  string *in_RSI;
  allocator local_a1;
  undefined1 local_a0 [8];
  undefined1 local_98 [32];
  string id;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  id_ptr;
  vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  arguments;
  
  this_00 = in_RSI + 1;
  pTVar4 = TokenReader::get_token((TokenReader *)this_00);
  if (pTVar4 == (Token *)0x0) {
    pPVar5 = (ParserException *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string
              ((string *)&id,"Expected function name, but could not find one.",(allocator *)local_98
              );
    exception::ParserException::ParserException(pPVar5,(Token *)0x0,in_RSI,&id);
    __cxa_throw(pPVar5,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = (*pTVar4->_vptr_Token[2])(pTVar4);
  if (iVar1 != 0) {
    pPVar5 = (ParserException *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string
              ((string *)&id,"Function name must be alphanumeric, and begin with a letter.",
               (allocator *)local_98);
    exception::ParserException::ParserException(pPVar5,pTVar4,in_RSI,&id);
    __cxa_throw(pPVar5,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
  }
  __dynamic_cast(pTVar4,&lexer::token::Token::typeinfo,&lexer::token::Text::typeinfo,0);
  lexer::token::Text::get_identifier_abi_cxx11_((Text *)&id_ptr);
  if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )id_ptr._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl ==
      (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )0x0) {
    pPVar5 = (ParserException *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string
              ((string *)&id,
               "Invalid function name. It must be alphanumeric, and begin with a letter.",
               (allocator *)local_98);
    exception::ParserException::ParserException(pPVar5,pTVar4,in_RSI,&id);
    __cxa_throw(pPVar5,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string
            ((string *)&id,
             (string *)
             id_ptr._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  iVar1 = TokenReader::check_limiter((TokenReader *)this_00,'(');
  if (iVar1 != 1) {
    pPVar5 = (ParserException *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string
              ((string *)local_98,"Expected \'(\' but could not find one.",(allocator *)&arguments);
    exception::ParserException::ParserException(pPVar5,pTVar4,in_RSI,(string *)local_98);
    __cxa_throw(pPVar5,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
  }
  TokenReader::get_token((TokenReader *)this_00);
  arguments.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  arguments.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  arguments.
  super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  do {
    iVar1 = TokenReader::check_limiter((TokenReader *)this_00,')');
    if (iVar1 != 0) break;
    parse_function_argument((Parser *)local_a0);
    std::
    vector<std::unique_ptr<ninx::parser::element::FunctionArgument,std::default_delete<ninx::parser::element::FunctionArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,std::default_delete<ninx::parser::element::FunctionArgument>>>>
    ::
    emplace_back<std::unique_ptr<ninx::parser::element::FunctionArgument,std::default_delete<ninx::parser::element::FunctionArgument>>>
              ((vector<std::unique_ptr<ninx::parser::element::FunctionArgument,std::default_delete<ninx::parser::element::FunctionArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,std::default_delete<ninx::parser::element::FunctionArgument>>>>
                *)&arguments,
               (unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
                *)local_a0);
    iVar2 = TokenReader::check_limiter((TokenReader *)this_00,',');
    if (iVar2 == 1) {
      TokenReader::get_token((TokenReader *)this_00);
    }
    else {
      iVar3 = TokenReader::check_limiter((TokenReader *)this_00,')');
      if (iVar3 != 1) {
        pTVar4 = TokenReader::get_token((TokenReader *)this_00);
        pPVar5 = (ParserException *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string
                  ((string *)local_98,"Another argument or end of arguments expected.",&local_a1);
        exception::ParserException::ParserException(pPVar5,pTVar4,in_RSI,(string *)local_98);
        __cxa_throw(pPVar5,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error)
        ;
      }
    }
    if (local_a0 != (undefined1  [8])0x0) {
      (**(code **)(*(long *)local_a0 + 8))();
    }
  } while (iVar2 == 1);
  TokenReader::get_token((TokenReader *)this_00);
  if (iVar1 != -1) {
    parse_block((Parser *)local_98);
    std::
    make_unique<ninx::parser::element::FunctionDefinition,std::__cxx11::string&,std::vector<std::unique_ptr<ninx::parser::element::FunctionArgument,std::default_delete<ninx::parser::element::FunctionArgument>>,std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,std::default_delete<ninx::parser::element::FunctionArgument>>>>,std::unique_ptr<ninx::parser::element::Block,std::default_delete<ninx::parser::element::Block>>>
              (&this->origin,
               (vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
                *)&id,(unique_ptr<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
                       *)&arguments);
    if ((long *)local_98._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_98._0_8_ + 8))();
    }
    std::
    vector<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
    ::~vector(&arguments);
    std::__cxx11::string::~string((string *)&id);
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&id_ptr);
    return (__uniq_ptr_data<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>,_true,_true>
            )(__uniq_ptr_data<ninx::parser::element::FunctionDefinition,_std::default_delete<ninx::parser::element::FunctionDefinition>,_true,_true>
              )this;
  }
  pPVar5 = (ParserException *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string
            ((string *)local_98,"Expected \')\' but EOF has been reached.",(allocator *)local_a0);
  exception::ParserException::ParserException(pPVar5,(Token *)0x0,in_RSI,(string *)local_98);
  __cxa_throw(pPVar5,&exception::ParserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<FunctionDefinition> ninx::parser::Parser::parse_function_definition() {
    // Extract the function definition identifier
    auto id_token{reader.get_token()};
    if (!id_token) {
        throw ParserException(id_token, this->origin, "Expected function name, but could not find one.");
    }
    if (id_token->get_type() != Type::TEXT) {
        throw ParserException(id_token, this->origin, "Function name must be alphanumeric, and begin with a letter.");
    }
    auto id_ptr{dynamic_cast<ninx::lexer::token::Text *>(id_token)->get_identifier()};
    if (!id_ptr) {
        throw ParserException(id_token, this->origin,
                              "Invalid function name. It must be alphanumeric, and begin with a letter.");
    }
    std::string id{*id_ptr};

    // Extract the parameters
    if (reader.check_limiter('(') != 1) {
        throw ParserException(id_token, this->origin, "Expected '(' but could not find one.");
    }
    reader.get_token();

    std::vector<std::unique_ptr<FunctionArgument>> arguments;

    // Cycle until a closing parenthesis is found or EOF is reached
    int result;
    while ((result = reader.check_limiter(')')) == 0) {
        auto argument{parse_function_argument()};

        arguments.push_back(std::move(argument));

        if (reader.check_limiter(',') == 1) {
            // Skip the period limiter
            reader.get_token();
        } else if (reader.check_limiter(')') == 1) {
            break;
        } else {
            auto error_token{reader.get_token()};
            throw ParserException(error_token, this->origin, "Another argument or end of arguments expected.");
        }
    }
    reader.get_token(); // Skip the closing parenthesis
    if (result == -1) {
        throw ParserException(nullptr, this->origin, "Expected ')' but EOF has been reached.");
    }

    // Parse the function block
    auto function_body{parse_block()};

    auto function_definition = std::make_unique<FunctionDefinition>(id, std::move(arguments), std::move(function_body));

    return function_definition;
}